

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void __thiscall SslUdpSocketImpl::Close(SslUdpSocketImpl *this)

{
  int iVar1;
  pointer pSVar2;
  type this_00;
  SSL *__val;
  wchar_t *pOut;
  type puVar3;
  __int_type local_c0;
  size_t len_1;
  __array temp_1;
  size_t len;
  __array temp;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_80;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  size_t local_30;
  size_t nOutDataSize;
  undefined1 local_20 [7];
  bool bNewData;
  unique_lock<std::mutex> lock;
  SslUdpSocketImpl *this_local;
  
  this->m_bCloseReq = true;
  lock._8_8_ = this;
  iVar1 = (*(this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[8])();
  if (iVar1 == 0) {
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    iVar1 = OpenSSLWrapper::SslConnection::SSLGetShutdown(pSVar2);
    if (iVar1 < 1) {
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)local_20,&this->m_mxEnDecode);
      nOutDataSize._7_1_ = 0;
      pSVar2 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      local_30 = OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
      while (local_30 != 0) {
        this_00 = std::
                  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                  ::operator*(&this->m_pSslCon);
        __val = OpenSSLWrapper::SslConnection::operator()(this_00);
        std::__cxx11::to_wstring((wstring *)&temp,(unsigned_long)__val);
        std::operator+(&local_80,L"SslGetOutDataSize unexpected full: ",
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )&temp);
        std::operator+(&local_60,&local_80,L"\r\n");
        pOut = (wchar_t *)std::__cxx11::wstring::c_str();
        OutputDebugString(pOut);
        std::__cxx11::wstring::~wstring((wstring *)&local_60);
        std::__cxx11::wstring::~wstring((wstring *)&local_80);
        std::__cxx11::wstring::~wstring((wstring *)&temp);
        std::make_unique<unsigned_char[]>((size_t)&len);
        pSVar2 = std::
                 unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ::operator->(&this->m_pSslCon);
        puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            &len,0);
        temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
        .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             OpenSSLWrapper::SslConnection::SslGetOutData(pSVar2,puVar3,local_30);
        if ((tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
            temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
            (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
          std::mutex::lock(&(this->super_UdpSocketImpl).m_mxOutDeque);
          std::__atomic_base<unsigned_long>::operator+=
                    (&(this->super_UdpSocketImpl).m_atOutBytes.super___atomic_base<unsigned_long>,
                     (__int_type)
                     temp_1._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string&>
                    ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                      *)&(this->super_UdpSocketImpl).m_quOutData,
                     (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len,
                     (unsigned_long *)&temp_1,&this->m_strDestAddr);
          std::mutex::unlock(&(this->super_UdpSocketImpl).m_mxOutDeque);
          nOutDataSize._7_1_ = 1;
        }
        pSVar2 = std::
                 unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ::operator->(&this->m_pSslCon);
        local_30 = OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len);
      }
      pSVar2 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      OpenSSLWrapper::SslConnection::ShutDownConnection(pSVar2,(int *)0x0);
      pSVar2 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      local_30 = OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
      while (local_30 != 0) {
        std::make_unique<unsigned_char[]>((size_t)&len_1);
        pSVar2 = std::
                 unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ::operator->(&this->m_pSslCon);
        puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            &len_1,0);
        local_c0 = OpenSSLWrapper::SslConnection::SslGetOutData(pSVar2,puVar3,local_30);
        if (local_c0 != 0) {
          std::mutex::lock(&(this->super_UdpSocketImpl).m_mxOutDeque);
          std::__atomic_base<unsigned_long>::operator+=
                    (&(this->super_UdpSocketImpl).m_atOutBytes.super___atomic_base<unsigned_long>,
                     local_c0);
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string&>
                    ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                      *)&(this->super_UdpSocketImpl).m_quOutData,
                     (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len_1,
                     &local_c0,&this->m_strDestAddr);
          std::mutex::unlock(&(this->super_UdpSocketImpl).m_mxOutDeque);
          nOutDataSize._7_1_ = 1;
        }
        pSVar2 = std::
                 unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ::operator->(&this->m_pSslCon);
        local_30 = OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len_1);
      }
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
      if ((nOutDataSize._7_1_ & 1) == 1) {
        UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
    }
  }
  UdpSocketImpl::Close(&this->super_UdpSocketImpl);
  return;
}

Assistant:

void SslUdpSocketImpl::Close()
{
    //OutputDebugString(L"SslTcpSocketImpl::Close\r\n");
    m_bCloseReq = true;

    if (GetErrorNo() == 0)  // We get here not because of an error
    {
        if (m_pSslCon->SSLGetShutdown() < SSL_SENT_SHUTDOWN)
        {
            unique_lock<mutex> lock(m_mxEnDecode);
            bool bNewData = false;

            size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
            while (nOutDataSize > 0)
            {
                OutputDebugString(wstring(L"SslGetOutDataSize unexpected full: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
                auto temp = make_unique<uint8_t[]>(nOutDataSize);
                const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                // Schreibt Daten in die SOCKET
                if (len > 0)
                {
                    m_mxOutDeque.lock();
                    m_atOutBytes += len;
                    m_quOutData.emplace_back(move(temp), len, m_strDestAddr);
                    m_mxOutDeque.unlock();
                    bNewData = true;
                }
                nOutDataSize = m_pSslCon->SslGetOutDataSize();
            }

            m_pSslCon->ShutDownConnection();
            // Get the out Que of the openssl bio, the buffer is already encrypted
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
            while (nOutDataSize > 0)
            {
                auto temp = make_unique<uint8_t[]>(nOutDataSize);
                const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                // Schreibt Daten in die SOCKET
                if (len > 0)
                {
                    m_mxOutDeque.lock();
                    m_atOutBytes += len;
                    m_quOutData.emplace_back(move(temp), len, m_strDestAddr);
                    m_mxOutDeque.unlock();
                    bNewData = true;
                }
                nOutDataSize = m_pSslCon->SslGetOutDataSize();
            }

            lock.unlock();

            if (bNewData == true)
                TriggerWriteThread();
        }
    }

    UdpSocketImpl::Close();
}